

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O0

void init_keymap(void)

{
  wchar_t local_c;
  wchar_t count;
  wchar_t i;
  
  memset(keymap,0,0xff8);
  keymap[0x103] = find_command("north");
  keymap[0x102] = find_command("south");
  keymap[0x104] = find_command("west");
  keymap[0x105] = find_command("east");
  keymap[0x15c] = find_command("north_west");
  keymap[0x15d] = find_command("north_east");
  keymap[0x15f] = find_command("south_west");
  keymap[0x160] = find_command("south_east");
  keymap[0x106] = find_command("north_west");
  keymap[0x153] = find_command("north_east");
  keymap[0x168] = find_command("south_west");
  keymap[0x152] = find_command("south_east");
  keymap[0xd] = find_command("(nothing)");
  for (local_c = L'\0'; local_c < cmdcount; local_c = local_c + L'\x01') {
    if (commandlist[local_c].defkey != '\0') {
      keymap[commandlist[local_c].defkey] = commandlist + local_c;
    }
  }
  for (local_c = 0; local_c < 0x22; local_c = local_c + 1) {
    if (builtin_commands[local_c].defkey != '\0') {
      keymap[builtin_commands[local_c].defkey] = builtin_commands + local_c;
    }
  }
  for (local_c = L'\0'; local_c < cmdcount; local_c = local_c + L'\x01') {
    if ((commandlist[local_c].altkey != '\0') &&
       (keymap[commandlist[local_c].altkey] == (nh_cmd_desc *)0x0)) {
      keymap[commandlist[local_c].altkey] = commandlist + local_c;
    }
  }
  for (local_c = 0; local_c < 0x22; local_c = local_c + 1) {
    if ((builtin_commands[local_c].altkey != '\0') &&
       (keymap[commandlist[local_c].altkey] == (nh_cmd_desc *)0x0)) {
      keymap[builtin_commands[local_c].altkey] = builtin_commands + local_c;
    }
  }
  return;
}

Assistant:

static void init_keymap(void)
{
    int i;
    int count = sizeof(builtin_commands)/sizeof(struct nh_cmd_desc);
    
    memset(keymap, 0, sizeof(keymap));
    
    /* num pad direction keys */
    keymap[KEY_UP] = find_command("north");
    keymap[KEY_DOWN] = find_command("south");
    keymap[KEY_LEFT] = find_command("west");
    keymap[KEY_RIGHT] = find_command("east");
    keymap[KEY_A1] = find_command("north_west");
    keymap[KEY_A3] = find_command("north_east");
    keymap[KEY_C1] = find_command("south_west");
    keymap[KEY_C3] = find_command("south_east");
    /* diagonal keypad keys are not necessarily reported as A1, A3, C1, C3 */
    keymap[KEY_HOME]  = find_command("north_west");
    keymap[KEY_PPAGE] = find_command("north_east");
    keymap[KEY_END]   = find_command("south_west");
    keymap[KEY_NPAGE] = find_command("south_east");
    keymap['\r'] = find_command("(nothing)");
    
    /* every command automatically gets its default key */
    for (i = 0; i < cmdcount; i++)
	if (commandlist[i].defkey)
	    keymap[keytrans(commandlist[i].defkey)] = &commandlist[i];
	
    for (i = 0; i < count; i++)
	if (builtin_commands[i].defkey)
	    keymap[keytrans(builtin_commands[i].defkey)] = &builtin_commands[i];
    
    /* alt keys are assigned if the key is not in use */
    for (i = 0; i < cmdcount; i++) {
	if (commandlist[i].altkey && !keymap[keytrans(commandlist[i].altkey)])
	    keymap[keytrans(commandlist[i].altkey)] = &commandlist[i];
    }
    
    for (i = 0; i < count; i++) {
	if (builtin_commands[i].altkey &&
	    !keymap[keytrans(commandlist[i].altkey)])
	    keymap[keytrans(builtin_commands[i].altkey)] = &builtin_commands[i];
    }
    
}